

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_session.cc
# Opt level: O3

uint32_t __thiscall bssl::ssl_hash_session_id(bssl *this,Span<const_unsigned_char> session_id)

{
  uchar *__n;
  bssl *__dest;
  uint8_t tmp_storage [4];
  undefined4 local_c;
  
  __n = session_id.data_;
  __dest = this;
  if (__n < (uchar *)0x4) {
    local_c = 0;
    if (__n == (uchar *)0x0) {
      __dest = (bssl *)&local_c;
    }
    else {
      __dest = (bssl *)&local_c;
      memcpy(__dest,this,(size_t)__n);
    }
  }
  return *(uint32_t *)__dest;
}

Assistant:

uint32_t ssl_hash_session_id(Span<const uint8_t> session_id) {
  // Take the first four bytes of |session_id|. Session IDs are generated by the
  // server randomly, so we can assume even using the first four bytes results
  // in a good distribution.
  uint8_t tmp_storage[sizeof(uint32_t)];
  if (session_id.size() < sizeof(tmp_storage)) {
    OPENSSL_memset(tmp_storage, 0, sizeof(tmp_storage));
    OPENSSL_memcpy(tmp_storage, session_id.data(), session_id.size());
    session_id = tmp_storage;
  }

  uint32_t hash = ((uint32_t)session_id[0]) | ((uint32_t)session_id[1] << 8) |
                  ((uint32_t)session_id[2] << 16) |
                  ((uint32_t)session_id[3] << 24);

  return hash;
}